

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deflate.c
# Opt level: O1

size_t EncodeTree(uint *ll_lengths,uint *d_lengths,int use_16,int use_17,int use_18,uchar *bp,
                 uchar **out,size_t *outsize)

{
  byte bVar1;
  uint symbol;
  long lVar2;
  long lVar3;
  uint *puVar4;
  void *__ptr;
  void *__ptr_00;
  uint uVar5;
  ulong uVar6;
  ulong uVar7;
  long lVar8;
  uint uVar9;
  uint uVar10;
  ulong uVar11;
  ulong uVar12;
  uint uVar13;
  uint *puVar14;
  uint *puVar15;
  ulong uVar16;
  ulong uVar17;
  ulong uVar18;
  long lVar19;
  ulong uVar20;
  size_t clcounts [19];
  uint clcl [19];
  uint clsymbols [19];
  size_t local_178 [20];
  uint local_d8 [20];
  uint local_88 [22];
  
  lVar19 = 0;
  memset(local_178,0,0x98);
  do {
    if (ll_lengths[lVar19 + 0x11d] != 0) {
      uVar11 = (ulong)((int)lVar19 + 0x1d);
      goto LAB_00104522;
    }
    lVar19 = lVar19 + -1;
  } while (lVar19 != -0x1d);
  uVar11 = 0;
LAB_00104522:
  uVar6 = 0x1d;
  do {
    if (d_lengths[uVar6] != 0) goto LAB_0010453a;
    uVar5 = (int)uVar6 - 1;
    uVar6 = (ulong)uVar5;
  } while (uVar5 != 0);
  uVar6 = 0;
LAB_0010453a:
  uVar5 = (uint)uVar11;
  symbol = (uint)uVar6;
  uVar13 = uVar5 + symbol + 0x102;
  uVar6 = (ulong)uVar13;
  if (uVar13 == 0) {
    uVar20 = 0;
    __ptr_00 = (void *)0x0;
    __ptr = (void *)0x0;
  }
  else {
    uVar16 = (ulong)(uVar5 + 0x101);
    __ptr = (void *)0x0;
    __ptr_00 = (void *)0x0;
    uVar20 = 0;
    uVar12 = 0;
    uVar17 = 0;
    do {
      puVar4 = d_lengths + (uVar17 - uVar16);
      if (uVar17 < uVar16) {
        puVar4 = ll_lengths + uVar17;
      }
      bVar1 = (byte)*puVar4;
      if (((use_16 != 0) || ((uVar18 = 1, use_18 != 0 || use_17 != 0 && (bVar1 == 0)))) &&
         (uVar18 = 1, uVar17 + 1 < uVar6)) {
        uVar18 = (ulong)((symbol + uVar5 + 0x102) - (int)uVar17);
        puVar4 = d_lengths + ((uVar17 - 0x100) - uVar11);
        puVar14 = ll_lengths + uVar17 + 1;
        uVar7 = 1;
        do {
          puVar15 = puVar4;
          if (uVar17 + uVar7 < uVar16) {
            puVar15 = puVar14;
          }
          if ((uint)bVar1 != *puVar15) {
            uVar18 = uVar7 & 0xffffffff;
            break;
          }
          uVar7 = uVar7 + 1;
          puVar4 = puVar4 + 1;
          puVar14 = puVar14 + 1;
        } while (uVar6 - uVar17 != uVar7);
      }
      uVar13 = (uint)uVar18;
      if ((bVar1 == 0) && (2 < uVar13)) {
        uVar10 = uVar13;
        if (use_18 != 0) {
          while (10 < uVar10) {
            uVar9 = (uint)uVar18;
            uVar10 = 0x8a;
            if (uVar9 < 0x8a) {
              uVar10 = uVar9;
            }
            if (out != (uchar **)0x0) {
              if ((uVar20 & uVar20 - 1) == 0) {
                if (uVar20 == 0) {
                  __ptr = malloc(4);
                }
                else {
                  __ptr = realloc(__ptr,uVar20 * 8);
                }
              }
              *(undefined4 *)((long)__ptr + uVar20 * 4) = 0x12;
              if ((uVar12 & uVar12 - 1) == 0) {
                if (uVar12 == 0) {
                  __ptr_00 = malloc(4);
                }
                else {
                  __ptr_00 = realloc(__ptr_00,uVar12 * 8);
                }
              }
              uVar20 = uVar20 + 1;
              *(uint *)((long)__ptr_00 + uVar12 * 4) = uVar10 - 0xb;
              uVar12 = uVar12 + 1;
            }
            local_178[0x12] = local_178[0x12] + 1;
            uVar18 = (ulong)(uVar9 - uVar10);
            uVar10 = uVar9 - uVar10;
          }
        }
        if (use_17 != 0) {
          uVar10 = (uint)uVar18;
          while (2 < uVar10) {
            uVar10 = (uint)uVar18;
            uVar9 = 10;
            if (uVar10 < 10) {
              uVar9 = uVar10;
            }
            if (out != (uchar **)0x0) {
              if ((uVar20 & uVar20 - 1) == 0) {
                if (uVar20 == 0) {
                  __ptr = malloc(4);
                }
                else {
                  __ptr = realloc(__ptr,uVar20 * 8);
                }
              }
              *(undefined4 *)((long)__ptr + uVar20 * 4) = 0x11;
              if ((uVar12 & uVar12 - 1) == 0) {
                if (uVar12 == 0) {
                  __ptr_00 = malloc(4);
                }
                else {
                  __ptr_00 = realloc(__ptr_00,uVar12 * 8);
                }
              }
              uVar20 = uVar20 + 1;
              *(uint *)((long)__ptr_00 + uVar12 * 4) = uVar9 - 3;
              uVar12 = uVar12 + 1;
            }
            local_178[0x11] = local_178[0x11] + 1;
            uVar10 = uVar10 - uVar9;
            uVar18 = (ulong)uVar10;
          }
        }
      }
      if ((use_16 != 0) && (3 < (uint)uVar18)) {
        local_178[bVar1] = local_178[bVar1] + 1;
        if (out != (uchar **)0x0) {
          if ((uVar20 & uVar20 - 1) == 0) {
            if (uVar20 == 0) {
              __ptr = malloc(4);
            }
            else {
              __ptr = realloc(__ptr,uVar20 * 8);
            }
          }
          *(uint *)((long)__ptr + uVar20 * 4) = (uint)bVar1;
          if ((uVar12 & uVar12 - 1) == 0) {
            if (uVar12 == 0) {
              __ptr_00 = malloc(4);
            }
            else {
              __ptr_00 = realloc(__ptr_00,uVar12 * 8);
            }
          }
          uVar20 = uVar20 + 1;
          *(undefined4 *)((long)__ptr_00 + uVar12 * 4) = 0;
          uVar12 = uVar12 + 1;
        }
        for (uVar10 = (uint)uVar18 - 1; uVar18 = (ulong)uVar10, 2 < uVar10; uVar10 = uVar10 - uVar9)
        {
          uVar9 = 6;
          if (uVar10 < 6) {
            uVar9 = uVar10;
          }
          if (out != (uchar **)0x0) {
            if ((uVar20 & uVar20 - 1) == 0) {
              if (uVar20 == 0) {
                __ptr = malloc(4);
              }
              else {
                __ptr = realloc(__ptr,uVar20 * 8);
              }
            }
            *(undefined4 *)((long)__ptr + uVar20 * 4) = 0x10;
            if ((uVar12 & uVar12 - 1) == 0) {
              if (uVar12 == 0) {
                __ptr_00 = malloc(4);
              }
              else {
                __ptr_00 = realloc(__ptr_00,uVar12 * 8);
              }
            }
            uVar20 = uVar20 + 1;
            *(uint *)((long)__ptr_00 + uVar12 * 4) = uVar9 - 3;
            uVar12 = uVar12 + 1;
          }
          local_178[0x10] = local_178[0x10] + 1;
        }
      }
      uVar10 = (uint)uVar18;
      local_178[bVar1] = local_178[bVar1] + uVar18;
      while (uVar10 != 0) {
        if (out != (uchar **)0x0) {
          if ((uVar20 & uVar20 - 1) == 0) {
            if (uVar20 == 0) {
              __ptr = malloc(4);
            }
            else {
              __ptr = realloc(__ptr,uVar20 * 8);
            }
          }
          *(uint *)((long)__ptr + uVar20 * 4) = (uint)bVar1;
          if ((uVar12 & uVar12 - 1) == 0) {
            if (uVar12 == 0) {
              __ptr_00 = malloc(4);
            }
            else {
              __ptr_00 = realloc(__ptr_00,uVar12 * 8);
            }
          }
          uVar20 = uVar20 + 1;
          *(undefined4 *)((long)__ptr_00 + uVar12 * 4) = 0;
          uVar12 = uVar12 + 1;
        }
        uVar10 = (int)uVar18 - 1;
        uVar18 = (ulong)uVar10;
      }
      uVar17 = uVar17 + (uVar13 - 1) + 1;
    } while (uVar17 < uVar6);
  }
  ZopfliCalculateBitLengths(local_178,0x13,7,local_d8);
  if (out != (uchar **)0x0) {
    ZopfliLengthsToSymbols(local_d8,0x13,7,local_88);
  }
  uVar11 = 0xf;
  do {
    if (local_178[EncodeTree::order[uVar11 + 3]] != 0) goto LAB_00104a64;
    uVar11 = uVar11 - 1;
  } while (uVar11 != 0);
  uVar11 = 0;
LAB_00104a64:
  uVar13 = (uint)uVar11;
  if (out != (uchar **)0x0) {
    AddBits(uVar5,5,bp,out,outsize);
    AddBits(symbol,5,bp,out,outsize);
    AddBits(uVar13,4,bp,out,outsize);
    if (uVar13 != 0xfffffffc) {
      lVar19 = 0;
      do {
        AddBits(local_d8[*(uint *)((long)EncodeTree::order + lVar19)],3,bp,out,outsize);
        lVar19 = lVar19 + 4;
      } while ((uVar11 & 0xffffffff) * 4 + 0x10 != lVar19);
    }
    if (uVar20 != 0) {
      uVar11 = 0;
      do {
        uVar5 = *(uint *)((long)__ptr + uVar11 * 4);
        AddHuffmanBits(local_88[uVar5],local_d8[uVar5],bp,out,outsize);
        uVar5 = *(int *)((long)__ptr + uVar11 * 4) - 0x10;
        if (uVar5 < 3) {
          AddBits(*(uint *)((long)__ptr_00 + uVar11 * 4),*(uint *)(&DAT_0010a22c + (ulong)uVar5 * 4)
                  ,bp,out,outsize);
        }
        uVar11 = uVar11 + 1;
      } while (uVar20 != uVar11);
    }
  }
  lVar19 = (ulong)(uVar13 * 3 + 0xc) + 0xe;
  lVar8 = 0;
  do {
    lVar19 = lVar19 + (ulong)local_d8[lVar8] * local_178[lVar8];
    lVar8 = lVar8 + 1;
  } while (lVar8 != 0x13);
  lVar8 = local_178[0x10] * 2;
  lVar3 = local_178[0x11] * 3;
  lVar2 = local_178[0x12] * 7;
  free(__ptr);
  free(__ptr_00);
  return lVar2 + lVar3 + lVar19 + lVar8;
}

Assistant:

static size_t EncodeTree(const unsigned* ll_lengths,
                         const unsigned* d_lengths,
                         int use_16, int use_17, int use_18,
                         unsigned char* bp,
                         unsigned char** out, size_t* outsize) {
  unsigned lld_total;  /* Total amount of literal, length, distance codes. */
  /* Runlength encoded version of lengths of litlen and dist trees. */
  unsigned* rle = 0;
  unsigned* rle_bits = 0;  /* Extra bits for rle values 16, 17 and 18. */
  size_t rle_size = 0;  /* Size of rle array. */
  size_t rle_bits_size = 0;  /* Should have same value as rle_size. */
  unsigned hlit = 29;  /* 286 - 257 */
  unsigned hdist = 29;  /* 32 - 1, but gzip does not like hdist > 29.*/
  unsigned hclen;
  unsigned hlit2;
  size_t i, j;
  size_t clcounts[19];
  unsigned clcl[19];  /* Code length code lengths. */
  unsigned clsymbols[19];
  /* The order in which code length code lengths are encoded as per deflate. */
  static const unsigned order[19] = {
    16, 17, 18, 0, 8, 7, 9, 6, 10, 5, 11, 4, 12, 3, 13, 2, 14, 1, 15
  };
  int size_only = !out;
  size_t result_size = 0;

  for(i = 0; i < 19; i++) clcounts[i] = 0;

  /* Trim zeros. */
  while (hlit > 0 && ll_lengths[257 + hlit - 1] == 0) hlit--;
  while (hdist > 0 && d_lengths[1 + hdist - 1] == 0) hdist--;
  hlit2 = hlit + 257;

  lld_total = hlit2 + hdist + 1;

  for (i = 0; i < lld_total; i++) {
    /* This is an encoding of a huffman tree, so now the length is a symbol */
    unsigned char symbol = i < hlit2 ? ll_lengths[i] : d_lengths[i - hlit2];
    unsigned count = 1;
    if(use_16 || (symbol == 0 && (use_17 || use_18))) {
      for (j = i + 1; j < lld_total && symbol ==
          (j < hlit2 ? ll_lengths[j] : d_lengths[j - hlit2]); j++) {
        count++;
      }
    }
    i += count - 1;

    /* Repetitions of zeroes */
    if (symbol == 0 && count >= 3) {
      if (use_18) {
        while (count >= 11) {
          unsigned count2 = count > 138 ? 138 : count;
          if (!size_only) {
            ZOPFLI_APPEND_DATA(18, &rle, &rle_size);
            ZOPFLI_APPEND_DATA(count2 - 11, &rle_bits, &rle_bits_size);
          }
          clcounts[18]++;
          count -= count2;
        }
      }
      if (use_17) {
        while (count >= 3) {
          unsigned count2 = count > 10 ? 10 : count;
          if (!size_only) {
            ZOPFLI_APPEND_DATA(17, &rle, &rle_size);
            ZOPFLI_APPEND_DATA(count2 - 3, &rle_bits, &rle_bits_size);
          }
          clcounts[17]++;
          count -= count2;
        }
      }
    }

    /* Repetitions of any symbol */
    if (use_16 && count >= 4) {
      count--;  /* Since the first one is hardcoded. */
      clcounts[symbol]++;
      if (!size_only) {
        ZOPFLI_APPEND_DATA(symbol, &rle, &rle_size);
        ZOPFLI_APPEND_DATA(0, &rle_bits, &rle_bits_size);
      }
      while (count >= 3) {
        unsigned count2 = count > 6 ? 6 : count;
        if (!size_only) {
          ZOPFLI_APPEND_DATA(16, &rle, &rle_size);
          ZOPFLI_APPEND_DATA(count2 - 3, &rle_bits, &rle_bits_size);
        }
        clcounts[16]++;
        count -= count2;
      }
    }

    /* No or insufficient repetition */
    clcounts[symbol] += count;
    while (count > 0) {
      if (!size_only) {
        ZOPFLI_APPEND_DATA(symbol, &rle, &rle_size);
        ZOPFLI_APPEND_DATA(0, &rle_bits, &rle_bits_size);
      }
      count--;
    }
  }

  ZopfliCalculateBitLengths(clcounts, 19, 7, clcl);
  if (!size_only) ZopfliLengthsToSymbols(clcl, 19, 7, clsymbols);

  hclen = 15;
  /* Trim zeros. */
  while (hclen > 0 && clcounts[order[hclen + 4 - 1]] == 0) hclen--;

  if (!size_only) {
    AddBits(hlit, 5, bp, out, outsize);
    AddBits(hdist, 5, bp, out, outsize);
    AddBits(hclen, 4, bp, out, outsize);

    for (i = 0; i < hclen + 4; i++) {
      AddBits(clcl[order[i]], 3, bp, out, outsize);
    }

    for (i = 0; i < rle_size; i++) {
      unsigned symbol = clsymbols[rle[i]];
      AddHuffmanBits(symbol, clcl[rle[i]], bp, out, outsize);
      /* Extra bits. */
      if (rle[i] == 16) AddBits(rle_bits[i], 2, bp, out, outsize);
      else if (rle[i] == 17) AddBits(rle_bits[i], 3, bp, out, outsize);
      else if (rle[i] == 18) AddBits(rle_bits[i], 7, bp, out, outsize);
    }
  }

  result_size += 14;  /* hlit, hdist, hclen bits */
  result_size += (hclen + 4) * 3;  /* clcl bits */
  for(i = 0; i < 19; i++) {
    result_size += clcl[i] * clcounts[i];
  }
  /* Extra bits. */
  result_size += clcounts[16] * 2;
  result_size += clcounts[17] * 3;
  result_size += clcounts[18] * 7;

  /* Note: in case of "size_only" these are null pointers so no effect. */
  free(rle);
  free(rle_bits);

  return result_size;
}